

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::ScalarDiscreteQuantile::GetFallback
          (AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_49;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,type);
  __l._M_len = 1;
  __l._M_array = &local_30;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,__l,&local_49);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_48,type,
             AggregateFunction::
             StateSize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>>,
             AggregateFunction::
             StateInitialize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileScalarFallback,(duckdb::AggregateDestructorType)1>
             ,AggregateSortKeyHelpers::
              UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileScalarFallback,(duckdb::OrderType)2,true>
             ,AggregateFunction::
              StateCombine<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileScalarFallback>
             ,AggregateFunction::
              StateVoidFinalize<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileScalarFallback>
             ,(aggregate_simple_update_t)0x0,(bind_aggregate_function_t)0x0,
             AggregateFunction::
             StateDestroy<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileScalarFallback>
             ,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  LogicalType::~LogicalType(&local_30);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFallback(const LogicalType &type) {
		using STATE = QuantileState<string_t, QuantileStringType>;
		using OP = QuantileScalarFallback;

		AggregateFunction fun({type}, type, AggregateFunction::StateSize<STATE>,
		                      AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
		                      AggregateSortKeyHelpers::UnaryUpdate<STATE, OP>,
		                      AggregateFunction::StateCombine<STATE, OP>,
		                      AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, nullptr,
		                      AggregateFunction::StateDestroy<STATE, OP>);
		return fun;
	}